

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratingInstance.cpp
# Opt level: O1

void __thiscall GeneratingInstance::Build(GeneratingInstance *this,Instance *instance)

{
  pointer *ppTVar1;
  Task *pTVar2;
  iterator __position;
  pointer pTVar3;
  Task TVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Task *task;
  pointer pTVar9;
  pointer pTVar10;
  long lVar11;
  Tasks *__range1;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Task local_38;
  
  iVar5 = rand();
  iVar6 = iVar5 % 0x61 + 3;
  iVar7 = rand();
  if (-3 < iVar5 % 0x61) {
    iVar13 = (iVar7 % 0x28 + 10) * iVar6;
    iVar5 = 0;
    iVar7 = 0;
    do {
      if (0 < iVar13) {
        iVar15 = 0;
        do {
          iVar8 = rand();
          iVar14 = iVar13 - iVar15;
          if (iVar8 % 1000 + iVar15 + 3 <= iVar13) {
            iVar14 = iVar8 % 1000 + 3;
          }
          __position._M_current =
               (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_38.length = iVar14;
          local_38.id = iVar5;
          if (__position._M_current ==
              (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Task,_std::allocator<Task>_>::_M_realloc_insert<Task>
                      (&instance->tasks,__position,&local_38);
          }
          else {
            TVar4.id = iVar5;
            TVar4.length = iVar14;
            *__position._M_current = TVar4;
            ppTVar1 = &(instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          iVar5 = iVar5 + 1;
          iVar15 = iVar14 + iVar15;
        } while (iVar15 < iVar13);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar6);
  }
  pTVar10 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar3 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pTVar10 != pTVar3) && (pTVar10 + 1 != pTVar3)) {
    lVar12 = 8;
    do {
      iVar5 = rand();
      lVar11 = (long)iVar5 % ((lVar12 >> 3) + 1);
      if (lVar12 != lVar11 * 8) {
        pTVar2 = (Task *)((long)&pTVar10->length + lVar12);
        TVar4 = *pTVar2;
        *pTVar2 = pTVar10[lVar11];
        pTVar10[lVar11] = TVar4;
      }
      pTVar9 = (pointer)((long)&pTVar10[1].length + lVar12);
      lVar12 = lVar12 + 8;
    } while (pTVar9 != pTVar3);
  }
  pTVar10 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar3 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar10 != pTVar3) {
    iVar5 = 0;
    do {
      pTVar10->id = iVar5;
      iVar5 = iVar5 + 1;
      pTVar10 = pTVar10 + 1;
    } while (pTVar10 != pTVar3);
  }
  instance->numProcessors = iVar6;
  return;
}

Assistant:

void GeneratingInstance::Build(Instance& instance){
	int numberOfCores = rand() % 97 + 3;
	int numberOfTaksSoFar = 0;
	int optimalProcessingTime = numberOfCores * (rand() %40 + 10);
	//Randomly generate Instance's optimum

	for(int i = 0; i < numberOfCores; i++){
		//For every core, generate a random number of tasks, which lengths (also random) when added equal optimum
		int coreLengthSoFar = 0;
		while(coreLengthSoFar<optimalProcessingTime){
			int newTaskLength = rand() %1000 + 3;
			if(coreLengthSoFar + newTaskLength > optimalProcessingTime)
			//Check if newTaskLength does not overload core (aka does not increase optimal processing time), if so trim new TaskLength, so it fits
				newTaskLength = optimalProcessingTime - coreLengthSoFar;

			instance.tasks.push_back(Task(newTaskLength, numberOfTaksSoFar));
			numberOfTaksSoFar++;
			coreLengthSoFar += newTaskLength;
		}
	}

	std::random_shuffle(instance.tasks.begin(), instance.tasks.end());
	//reshuffle for even more random result
	
	int i = 0;
	for(auto& task : instance.tasks){
		task.setId(i);
		i++;
	}

	instance.numProcessors = numberOfCores;
}